

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reformat.c
# Opt level: O2

int main(int argc,char **argv)

{
  yajl_status yVar1;
  int iVar2;
  int extraout_EAX;
  yajl_gen g;
  yajl_handle h;
  size_t sVar3;
  uchar *str;
  undefined8 uVar4;
  yajl_gen_option opt;
  long lVar5;
  char *__s;
  ulong uVar6;
  size_t len;
  uchar *buf;
  
  g = yajl_gen_alloc((yajl_alloc_funcs *)0x0);
  yajl_gen_config(g,yajl_gen_beautify,1);
  yajl_gen_config(g,yajl_gen_validate_utf8,1);
  h = yajl_alloc(&callbacks,(yajl_alloc_funcs *)0x0,g);
  yajl_config(h,yajl_allow_comments,1);
  for (lVar5 = 1; lVar5 < argc; lVar5 = lVar5 + 1) {
    __s = argv[lVar5];
    if ((*__s != '-') || (sVar3 = strlen(__s), sVar3 < 2)) {
LAB_001024b4:
      usage(*argv);
      return extraout_EAX;
    }
    for (uVar6 = 1; sVar3 = strlen(__s), uVar6 < sVar3; uVar6 = (ulong)((int)uVar6 + 1)) {
      switch((int)__s[uVar6] - 0x65U >> 1 | (uint)(((int)__s[uVar6] - 0x65U & 1) != 0) << 0x1f) {
      case 0:
        opt = yajl_gen_escape_solidus;
        uVar4 = 1;
        goto LAB_00102361;
      default:
        fprintf(_stderr,"unrecognized option: \'%c\'\n\n");
        goto LAB_001024b4;
      case 4:
        uVar4 = 0;
        opt = yajl_gen_beautify;
LAB_00102361:
        yajl_gen_config(g,opt,uVar4);
        break;
      case 7:
        yajl_config(h,yajl_allow_multiple_values,1);
        s_streamReformat = 1;
        break;
      case 8:
        yajl_config(h,yajl_dont_validate_strings,1);
      }
      __s = argv[lVar5];
    }
  }
  while (sVar3 = fread(main::fileData,1,0xffff,_stdin), sVar3 != 0) {
    main::fileData[sVar3] = '\0';
    yVar1 = yajl_parse(h,main::fileData,sVar3);
    if (yVar1 != yajl_status_ok) goto LAB_0010240a;
    yajl_gen_get_buf(g,&buf,&len);
    fwrite(buf,1,len,_stdout);
    yajl_gen_clear(g);
  }
  iVar2 = feof(_stdin);
  if (iVar2 == 0) {
    fwrite("error on file read.\n",0x14,1,_stderr);
    iVar2 = 1;
  }
  else {
LAB_0010240a:
    iVar2 = 0;
  }
  yVar1 = yajl_complete_parse(h);
  if (yVar1 != yajl_status_ok) {
    iVar2 = 1;
    str = yajl_get_error(h,1,main::fileData,sVar3);
    fputs((char *)str,_stderr);
    yajl_free_error(h,str);
  }
  yajl_gen_free(g);
  yajl_free(h);
  return iVar2;
}

Assistant:

int
main(int argc, char ** argv)
{
    yajl_handle hand;
    static unsigned char fileData[65536];
    /* generator config */
    yajl_gen g;
    yajl_status stat;
    size_t rd;
    int retval = 0;
    int a = 1;

    g = yajl_gen_alloc(NULL);
    yajl_gen_config(g, yajl_gen_beautify, 1);
    yajl_gen_config(g, yajl_gen_validate_utf8, 1);

    /* ok.  open file.  let's read and parse */
    hand = yajl_alloc(&callbacks, NULL, (void *) g);
    /* and let's allow comments by default */
    yajl_config(hand, yajl_allow_comments, 1);

    /* check arguments.*/
    while ((a < argc) && (argv[a][0] == '-') && (strlen(argv[a]) > 1)) {
        unsigned int i;
        for ( i=1; i < strlen(argv[a]); i++) {
            switch (argv[a][i]) {
                case 'm':
                    yajl_gen_config(g, yajl_gen_beautify, 0);
                    break;
                case 's':
                    yajl_config(hand, yajl_allow_multiple_values, 1);
                    s_streamReformat = 1;
                    break;
                case 'u':
                    yajl_config(hand, yajl_dont_validate_strings, 1);
                    break;
                case 'e':
                    yajl_gen_config(g, yajl_gen_escape_solidus, 1);
                    break;
                default:
                    fprintf(stderr, "unrecognized option: '%c'\n\n",
                            argv[a][i]);
                    usage(argv[0]);
            }
        }
        ++a;
    }
    if (a < argc) {
        usage(argv[0]);
    }


    for (;;) {
        rd = fread((void *) fileData, 1, sizeof(fileData) - 1, stdin);

        if (rd == 0) {
            if (!feof(stdin)) {
                fprintf(stderr, "error on file read.\n");
                retval = 1;
            }
            break;
        }
        fileData[rd] = 0;

        stat = yajl_parse(hand, fileData, rd);

        if (stat != yajl_status_ok) break;

        {
            const unsigned char * buf;
            size_t len;
            yajl_gen_get_buf(g, &buf, &len);
            fwrite(buf, 1, len, stdout);
            yajl_gen_clear(g);
        }
    }

    stat = yajl_complete_parse(hand);

    if (stat != yajl_status_ok) {
        unsigned char * str = yajl_get_error(hand, 1, fileData, rd);
        fprintf(stderr, "%s", (const char *) str);
        yajl_free_error(hand, str);
        retval = 1;
    }

    yajl_gen_free(g);
    yajl_free(hand);

    return retval;
}